

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

void __thiscall
Liby::
BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
BlockingQueue(BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    elements)

{
  const_iterator pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  elements_local;
  
  elements_local._M_array = (iterator)elements._M_len;
  this_local = (BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)elements._M_array;
  std::mutex::mutex(&this->mutex_);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->queue_);
  std::condition_variable::condition_variable(&this->cond_);
  __end0 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&this_local);
  pbVar1 = std::
           initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this_local);
  for (; __end0 != pbVar1; __end0 = __end0 + 1) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->queue_,
               __end0);
  }
  return;
}

Assistant:

BlockingQueue(std::initializer_list<T> elements = {}) {
        for (auto &e : elements) {
            queue_.emplace_back(e);
        }
    }